

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O3

Maybe<kj::Own<const_kj::File,_std::nullptr_t>_> __thiscall
kj::anon_unknown_9::DiskDirectory::tryOpenFile(DiskDirectory *this,PathPtr path,WriteMode mode)

{
  File *pFVar1;
  File *extraout_RDX;
  bool in_R8B;
  Maybe<kj::Own<kj::File,_std::nullptr_t>_> MVar2;
  Maybe<kj::Own<const_kj::File,_std::nullptr_t>_> MVar3;
  PathPtr path_00;
  DiskHandle local_30;
  OwnFd local_2c;
  NullableValue<kj::OwnFd> local_28;
  undefined8 uStack_20;
  
  path_00.parts.size_ = path.parts.size_;
  path_00.parts.ptr = &((path.parts.ptr)->content).size_;
  DiskHandle::tryOpenFileInternal(&local_30,path_00,mode,in_R8B);
  MVar2 = Maybe<kj::OwnFd>::map<kj::Own<kj::File,_std::nullptr_t>_(&)(kj::OwnFd)>
                    ((Maybe<kj::OwnFd> *)&local_28,
                     (_func_Own<kj::File,_std::nullptr_t>_OwnFd *)&local_30);
  pFVar1 = MVar2.ptr.ptr;
  (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode = (_func_int **)local_28
  ;
  *(undefined8 *)&this->super_DiskHandle = uStack_20;
  uStack_20 = 0;
  if ((char)local_30.fd.fd == '\x01') {
    OwnFd::~OwnFd(&local_2c);
    pFVar1 = extraout_RDX;
  }
  MVar3.ptr.ptr = pFVar1;
  MVar3.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<const_kj::File,_std::nullptr_t>_>)MVar3.ptr;
}

Assistant:

Maybe<Own<const File>> tryOpenFile(PathPtr path, WriteMode mode) const override {
    return DiskHandle::tryOpenFile(path, mode);
  }